

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O0

bool ShaderParserParse(string *base_path,string *path,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *watches,vector<RenderPass,_std::allocator<RenderPass>_> *render_passes,
                      vector<GUIComponent,_std::allocator<GUIComponent>_> *components,
                      string *read_file_error)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  reference pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  uint local_334;
  undefined1 local_330 [4];
  uint32_t current_char_1;
  undefined1 local_310 [8];
  string gui_component_line;
  GUIComponent component;
  undefined1 local_288 [8];
  RenderPass new_pass;
  allocator<char> local_1c1;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  FErrorReport local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  uint local_13c;
  undefined1 local_138 [4];
  uint32_t current_char;
  string line;
  size_t i;
  anon_class_8_1_efc841ae report_error;
  RenderPass *pass;
  vector<Texture,_std::allocator<Texture>_> textures;
  string prev_line;
  string source;
  undefined1 local_a0 [4];
  uint32_t line_number;
  vector<GUIComponent,_std::allocator<GUIComponent>_> previous_components;
  vector<GUIComponent,_std::allocator<GUIComponent>_> new_components;
  undefined1 local_60 [8];
  string amalgamate;
  string *read_file_error_local;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *components_local;
  vector<RenderPass,_std::allocator<RenderPass>_> *render_passes_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *watches_local;
  string *path_local;
  string *base_path_local;
  
  amalgamate.field_2._8_8_ = read_file_error;
  std::__cxx11::string::string((string *)local_60);
  bVar3 = ShaderParserAmalgamate
                    (base_path,path,watches,(string *)amalgamate.field_2._8_8_,(string *)local_60);
  if (!bVar3) {
    base_path_local._7_1_ = 0;
    goto LAB_00136bb6;
  }
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)
             &previous_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_a0,components);
  source.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)(prev_line.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Texture,_std::allocator<Texture>_>::vector
            ((vector<Texture,_std::allocator<Texture>_> *)&pass);
  report_error.read_file_error = (string *)0x0;
  i = amalgamate.field_2._8_8_;
  for (line.field_2._8_8_ = 0; uVar2 = line.field_2._8_8_, uVar5 = std::__cxx11::string::size(),
      (ulong)uVar2 < uVar5; line.field_2._8_8_ = line.field_2._8_8_ + 1) {
    std::__cxx11::string::string((string *)local_138);
    while (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_60), *pcVar6 != '\n') {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
      std::__cxx11::string::operator+=((string *)local_138,*pcVar6);
      line.field_2._8_8_ = line.field_2._8_8_ + 1;
    }
    local_13c = 0;
    while( true ) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_138);
      iVar4 = isspace((int)*pcVar6);
      if (iVar4 == 0) break;
      local_13c = local_13c + 1;
    }
    uVar5 = (ulong)local_13c;
    uVar7 = std::__cxx11::string::length();
    if ((uVar5 < uVar7) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[]
                                   ((ulong)&textures.
                                            super__Vector_base<Texture,_std::allocator<Texture>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage),
       *pcVar6 == '@')) {
      std::__cxx11::string::substr
                ((ulong)&local_160,
                 (ulong)&textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      bVar3 = std::operator==(&local_160,"path");
      std::__cxx11::string::~string((string *)&local_160);
      uVar1 = local_13c;
      if (bVar3) {
        std::function<void(std::__cxx11::string_const&,unsigned_int)>::
        function<ShaderParserParse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<RenderPass,std::allocator<RenderPass>>&,std::vector<GUIComponent,std::allocator<GUIComponent>>&,std::__cxx11::string&)::__0&,void>
                  ((function<void(std::__cxx11::string_const&,unsigned_int)> *)&local_180,
                   (anon_class_8_1_efc841ae *)&i);
        bVar3 = ShaderParserParseTextures
                          (base_path,
                           (string *)
                           &textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(string *)local_138,uVar1,
                           source.field_2._12_4_,&local_180,watches,
                           (vector<Texture,_std::allocator<Texture>_> *)&pass);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
        ::~function(&local_180);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          base_path_local._7_1_ = 0;
          bVar3 = true;
          goto LAB_001368f8;
        }
        goto LAB_00136848;
      }
      std::__cxx11::string::substr
                ((ulong)&local_1a0,
                 (ulong)&textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      bVar3 = std::operator==(&local_1a0,"pass_end");
      std::__cxx11::string::~string((string *)&local_1a0);
      if (bVar3) {
        if (report_error.read_file_error != (string *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)&report_error.read_file_error[1]._M_string_length,
                     (string *)(prev_line.field_2._M_local_buf + 8));
          std::vector<Texture,_std::allocator<Texture>_>::operator=
                    ((vector<Texture,_std::allocator<Texture>_> *)
                     &(report_error.read_file_error)->field_2,
                     (vector<Texture,_std::allocator<Texture>_> *)&pass);
          std::__cxx11::string::clear();
          std::vector<Texture,_std::allocator<Texture>_>::clear
                    ((vector<Texture,_std::allocator<Texture>_> *)&pass);
          report_error.read_file_error = (string *)0x0;
          goto LAB_00136848;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"@pass_end was declared without @pass",&local_1c1);
        ShaderParserParse::anon_class_8_1_efc841ae::operator()
                  ((anon_class_8_1_efc841ae *)&i,&local_1c0,source.field_2._12_4_);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator(&local_1c1);
        base_path_local._7_1_ = 0;
        bVar3 = true;
      }
      else {
        std::__cxx11::string::substr
                  ((ulong)&new_pass.TextureId,
                   (ulong)&textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&new_pass.TextureId,"pass");
        std::__cxx11::string::~string((string *)&new_pass.TextureId);
        if (bVar3) {
          RenderPass::RenderPass((RenderPass *)local_288);
          uVar1 = local_13c;
          std::function<void(std::__cxx11::string_const&,unsigned_int)>::
          function<ShaderParserParse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<RenderPass,std::allocator<RenderPass>>&,std::vector<GUIComponent,std::allocator<GUIComponent>>&,std::__cxx11::string&)::__0&,void>
                    ((function<void(std::__cxx11::string_const&,unsigned_int)> *)
                     (component.Data + 3),(anon_class_8_1_efc841ae *)&i);
          bVar3 = ShaderParserParseRenderPass
                            ((string *)
                             &textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage,(string *)local_138,uVar1,
                             source.field_2._12_4_,(FErrorReport *)(component.Data + 3),
                             (RenderPass *)local_288);
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
          ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
                       *)(component.Data + 3));
          bVar3 = ((bVar3 ^ 0xffU) & 1) != 0;
          if (bVar3) {
            base_path_local._7_1_ = 0;
          }
          else {
            std::vector<RenderPass,_std::allocator<RenderPass>_>::push_back
                      (render_passes,(value_type *)local_288);
            report_error.read_file_error =
                 (string *)std::vector<RenderPass,_std::allocator<RenderPass>_>::back(render_passes)
            ;
          }
          RenderPass::~RenderPass((RenderPass *)local_288);
        }
        else {
          GUIComponent::GUIComponent((GUIComponent *)((long)&gui_component_line.field_2 + 8));
          std::__cxx11::string::substr
                    ((ulong)local_310,
                     (ulong)&textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
          bVar3 = GUIComponentParse(source.field_2._12_4_,(string *)local_310,(string *)local_138,
                                    (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_a0,
                                    (GUIComponent *)((long)&gui_component_line.field_2 + 8),
                                    (string *)amalgamate.field_2._8_8_);
          if (bVar3) {
            std::vector<GUIComponent,_std::allocator<GUIComponent>_>::push_back
                      ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)
                       &previous_components.
                        super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (value_type *)((long)&gui_component_line.field_2 + 8));
          }
          else {
            base_path_local._7_1_ = 0;
          }
          bVar3 = !bVar3;
          std::__cxx11::string::~string((string *)local_310);
          GUIComponent::~GUIComponent((GUIComponent *)((long)&gui_component_line.field_2 + 8));
        }
        if (!bVar3) goto LAB_00136848;
      }
    }
    else {
LAB_00136848:
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_138);
      if (*pcVar6 != '@') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"\n");
        std::__cxx11::string::operator+=
                  ((string *)(prev_line.field_2._M_local_buf + 8),(string *)local_330);
        std::__cxx11::string::~string((string *)local_330);
      }
      std::__cxx11::string::operator=
                ((string *)
                 &textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)local_138);
      source.field_2._12_4_ = source.field_2._12_4_ + 1;
      bVar3 = false;
    }
LAB_001368f8:
    std::__cxx11::string::~string((string *)local_138);
    if (bVar3) goto LAB_00136b40;
  }
  if (report_error.read_file_error == (string *)0x0) {
    bVar3 = std::vector<RenderPass,_std::allocator<RenderPass>_>::empty(render_passes);
    if (bVar3) {
      std::vector<RenderPass,_std::allocator<RenderPass>_>::emplace_back<>(render_passes);
      pvVar8 = std::vector<RenderPass,_std::allocator<RenderPass>_>::back(render_passes);
      std::__cxx11::string::operator=
                ((string *)&pvVar8->ShaderSource,(string *)(prev_line.field_2._M_local_buf + 8));
      pvVar8 = std::vector<RenderPass,_std::allocator<RenderPass>_>::back(render_passes);
      pvVar8->IsMain = true;
      pvVar8 = std::vector<RenderPass,_std::allocator<RenderPass>_>::back(render_passes);
      std::vector<Texture,_std::allocator<Texture>_>::operator=
                (&pvVar8->Textures,(vector<Texture,_std::allocator<Texture>_> *)&pass);
    }
LAB_00136b28:
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::operator=
              (components,
               (vector<GUIComponent,_std::allocator<GUIComponent>_> *)
               &previous_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    base_path_local._7_1_ = 1;
  }
  else {
    local_334 = 0;
    while( true ) {
      pcVar6 = (char *)std::__cxx11::string::operator[]
                                 ((ulong)&textures.
                                          super__Vector_base<Texture,_std::allocator<Texture>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar4 = isspace((int)*pcVar6);
      if (iVar4 == 0) break;
      local_334 = local_334 + 1;
    }
    uVar5 = (ulong)local_334;
    uVar7 = std::__cxx11::string::length();
    if ((uVar5 < uVar7) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[]
                                   ((ulong)&textures.
                                            super__Vector_base<Texture,_std::allocator<Texture>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage),
       *pcVar6 == '@')) {
      std::__cxx11::string::operator=
                ((string *)&report_error.read_file_error[1]._M_string_length,
                 (string *)(prev_line.field_2._M_local_buf + 8));
      std::vector<Texture,_std::allocator<Texture>_>::operator=
                ((vector<Texture,_std::allocator<Texture>_> *)
                 &(report_error.read_file_error)->field_2,
                 (vector<Texture,_std::allocator<Texture>_> *)&pass);
      goto LAB_00136b28;
    }
    std::operator+(&local_378,"Render pass ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &report_error.read_file_error[3]._M_string_length);
    std::operator+(&local_358,&local_378," was declared without @pass_end");
    std::__cxx11::string::operator=((string *)amalgamate.field_2._8_8_,(string *)&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    base_path_local._7_1_ = 0;
  }
LAB_00136b40:
  std::vector<Texture,_std::allocator<Texture>_>::~vector
            ((vector<Texture,_std::allocator<Texture>_> *)&pass);
  std::__cxx11::string::~string
            ((string *)
             &textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(prev_line.field_2._M_local_buf + 8));
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_a0);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)
             &previous_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00136bb6:
  std::__cxx11::string::~string((string *)local_60);
  return (bool)(base_path_local._7_1_ & 1);
}

Assistant:

bool ShaderParserParse(const std::string& base_path, const std::string& path, std::vector<std::string>& watches, std::vector<RenderPass>& render_passes, std::vector<GUIComponent>& components, std::string& read_file_error) {
    std::string amalgamate;

    if (!ShaderParserAmalgamate(base_path, path, watches, read_file_error, amalgamate)) {
        return false;
    }

    std::vector<GUIComponent> new_components;
    std::vector<GUIComponent> previous_components = components;

    uint32_t line_number = 0;
    std::string source;
    std::string prev_line;
    std::vector<Texture> textures;
    RenderPass* pass = nullptr;

    auto report_error = [&](const std::string& error, uint32_t line_number) {
        read_file_error = error + " at line " + std::to_string(line_number);
    };

    for (size_t i = 0; i < amalgamate.size(); ++i) {
        std::string line;

        while (amalgamate[i] != '\n') {
            line += amalgamate[i];
            ++i;
        }

        uint32_t current_char = 0;
        while (isspace(line[current_char])) {
            ++current_char;
        }

        if (current_char < prev_line.length() && prev_line[current_char] == '@') {
            if (prev_line.substr(current_char + 1, current_char + 4) == "path") {
                if (!ShaderParserParseTextures(base_path, prev_line, line, current_char, line_number, report_error, watches, textures)) {
                    return false;
                }
            } else if (prev_line.substr(current_char + 1, current_char + 8) == "pass_end") {
                if (!pass) {
                    report_error("@pass_end was declared without @pass", line_number);
                    return false;
                }

                pass->ShaderSource = std::move(source);
                pass->Textures = std::move(textures);

                source.clear();
                textures.clear();

                pass = nullptr;
            } else if (prev_line.substr(current_char + 1, current_char + 4) == "pass") {
                RenderPass new_pass;
                if (!ShaderParserParseRenderPass(prev_line, line, current_char, line_number, report_error, new_pass)) {
                    return false;
                }

                render_passes.push_back(new_pass);
                pass = &render_passes.back();
            } else {
                GUIComponent component;
                std::string gui_component_line = prev_line.substr(current_char + 1, std::string::npos);
                if (!GUIComponentParse(line_number, gui_component_line, line, previous_components, component, read_file_error)) {
                    return false;
                }

                new_components.push_back(component);
            }
        }

        if (line[current_char] != '@') {
            source += line + "\n";
        }

        prev_line = line;
        ++line_number;
    }

    if (pass) {
        uint32_t current_char = 0;
        while (isspace(prev_line[current_char])) {
            ++current_char;
        }
        if (current_char < prev_line.length() && prev_line[current_char] == '@') {
            pass->ShaderSource = std::move(source);
            pass->Textures = std::move(textures);
        } else {
            read_file_error = "Render pass " + pass->Output + " was declared without @pass_end";
            return false;
        }
    } else  if (render_passes.empty()) {
        render_passes.emplace_back();
        render_passes.back().ShaderSource = std::move(source);
        render_passes.back().IsMain = true;
        render_passes.back().Textures = textures;
    }

    components = std::move(new_components);

    return true;
}